

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

Ivy_Man_t * Ivy_FraigMiter(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  Ivy_Man_t *p;
  abctime aVar1;
  Ivy_FraigMan_t *p_00;
  Ivy_Man_t *pIVar2;
  Vec_Ptr_t *pVVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *p1;
  void *pvVar6;
  abctime aVar7;
  int iVar8;
  
  aVar1 = Abc_Clock();
  if (pManAig->nObjs[4] == 0) {
    p_00 = (Ivy_FraigMan_t *)calloc(1,0x138);
    p_00->pParams = pParams;
    p_00->pManAig = pManAig;
    pIVar2 = Ivy_ManStartFrom(pManAig);
    p_00->pManFraig = pIVar2;
    pVVar3 = Vec_PtrAlloc(100);
    p_00->vPiVars = pVVar3;
    for (iVar8 = 0; iVar8 < pManAig->vObjs->nSize; iVar8 = iVar8 + 1) {
      pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(pManAig->vObjs,iVar8);
      if ((pIVar4 != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pIVar4->field_0x8 & 0xf) - 7)) {
        pIVar5 = Ivy_ObjChild0Equiv(pIVar4);
        p1 = Ivy_ObjChild1Equiv(pIVar4);
        pIVar5 = Ivy_And(pIVar2,pIVar5,p1);
        pIVar4->pEquiv = pIVar5;
      }
    }
    Ivy_FraigMiterProve(p_00);
    pIVar2 = p_00->pManAig;
    for (iVar8 = 0; pVVar3 = pIVar2->vPos, iVar8 < pVVar3->nSize; iVar8 = iVar8 + 1) {
      pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(pVVar3,iVar8);
      p = p_00->pManFraig;
      pIVar4 = Ivy_ObjChild0Equiv(pIVar4);
      Ivy_ObjCreatePo(p,pIVar4);
    }
    pIVar2 = p_00->pManFraig;
    for (iVar8 = 0; iVar8 < pIVar2->vObjs->nSize; iVar8 = iVar8 + 1) {
      pvVar6 = Vec_PtrEntry(pIVar2->vObjs,iVar8);
      if (pvVar6 != (void *)0x0) {
        if (*(Vec_Ptr_t **)((long)pvVar6 + 0x30) != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree(*(Vec_Ptr_t **)((long)pvVar6 + 0x30));
        }
        *(undefined8 *)((long)pvVar6 + 0x28) = 0;
        *(undefined8 *)((long)pvVar6 + 0x30) = 0;
      }
    }
    Ivy_ManCleanup(pIVar2);
    aVar7 = Abc_Clock();
    p_00->timeTotal = aVar7 - aVar1;
    Ivy_FraigStop(p_00);
    return pIVar2;
  }
  __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x1e8,"Ivy_Man_t *Ivy_FraigMiter(Ivy_Man_t *, Ivy_FraigParams_t *)");
}

Assistant:

Ivy_Man_t * Ivy_FraigMiter( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_Man_t * pManAigNew;
    Ivy_Obj_t * pObj;
    int i;
    abctime clk;
clk = Abc_Clock();
    assert( Ivy_ManLatchNum(pManAig) == 0 );
    p = Ivy_FraigStartSimple( pManAig, pParams );
    // set global limits
    p->nBTLimitGlobal  = s_nBTLimitGlobal;
    p->nInsLimitGlobal = s_nInsLimitGlobal; 
    // duplicate internal nodes
    Ivy_ManForEachNode( p->pManAig, pObj, i )
        pObj->pEquiv = Ivy_And( p->pManFraig, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
    // try to prove each output of the miter
    Ivy_FraigMiterProve( p );
    // add the POs
    Ivy_ManForEachPo( p->pManAig, pObj, i )
        Ivy_ObjCreatePo( p->pManFraig, Ivy_ObjChild0Equiv(pObj) );
    // clean the new manager
    Ivy_ManForEachObj( p->pManFraig, pObj, i )
    {
        if ( Ivy_ObjFaninVec(pObj) )
            Vec_PtrFree( Ivy_ObjFaninVec(pObj) );
        pObj->pNextFan0 = pObj->pNextFan1 = NULL;
    }
    // remove dangling nodes 
    Ivy_ManCleanup( p->pManFraig );
    pManAigNew = p->pManFraig;
p->timeTotal = Abc_Clock() - clk;

//printf( "Final nodes = %6d. ", Ivy_ManNodeNum(pManAigNew) );
//ABC_PRT( "Time", p->timeTotal );
    Ivy_FraigStop( p );
    return pManAigNew;
}